

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fopen.c
# Opt level: O0

CURLcode Curl_fopen(Curl_easy *data,char *filename,FILE **fh,char **tempname)

{
  int iVar1;
  FILE *pFVar2;
  char *pcVar3;
  char *dir;
  undefined1 local_100 [4];
  int fd;
  stat sb;
  char *tempstore;
  uchar randbuf [41];
  CURLcode local_34;
  CURLcode result;
  char **tempname_local;
  FILE **fh_local;
  char *filename_local;
  Curl_easy *data_local;
  
  local_34 = CURLE_WRITE_ERROR;
  sb.__glibc_reserved[2] = 0;
  dir._4_4_ = -1;
  *tempname = (char *)0x0;
  pFVar2 = fopen64(filename,"w");
  *fh = (FILE *)pFVar2;
  if (*fh != (FILE *)0x0) {
    iVar1 = fileno((FILE *)*fh);
    iVar1 = fstat64(iVar1,(stat64 *)local_100);
    if ((iVar1 == -1) || (((uint)sb.st_nlink & 0xf000) != 0x8000)) {
      return CURLE_OK;
    }
    fclose((FILE *)*fh);
    *fh = (FILE *)0x0;
    local_34 = Curl_rand_alnum(data,(uchar *)&tempstore,0x29);
    if (local_34 == CURLE_OK) {
      pcVar3 = dirslash(filename);
      if (pcVar3 != (char *)0x0) {
        sb.__glibc_reserved[2] = (__syscall_slong_t)curl_maprintf("%s%s.tmp",pcVar3,&tempstore);
        (*Curl_cfree)(pcVar3);
      }
      if (sb.__glibc_reserved[2] == 0) {
        local_34 = CURLE_OUT_OF_MEMORY;
      }
      else {
        local_34 = CURLE_WRITE_ERROR;
        dir._4_4_ = open64((char *)sb.__glibc_reserved[2],0xc1,(ulong)((uint)sb.st_nlink | 0x180));
        if (dir._4_4_ != -1) {
          pFVar2 = fdopen(dir._4_4_,"w");
          *fh = (FILE *)pFVar2;
          if (*fh != (FILE *)0x0) {
            *tempname = (char *)sb.__glibc_reserved[2];
            return CURLE_OK;
          }
        }
      }
    }
  }
  if (dir._4_4_ != -1) {
    close(dir._4_4_);
    unlink((char *)sb.__glibc_reserved[2]);
  }
  (*Curl_cfree)((void *)sb.__glibc_reserved[2]);
  return local_34;
}

Assistant:

CURLcode Curl_fopen(struct Curl_easy *data, const char *filename,
                    FILE **fh, char **tempname)
{
  CURLcode result = CURLE_WRITE_ERROR;
  unsigned char randbuf[41];
  char *tempstore = NULL;
  struct_stat sb;
  int fd = -1;
  char *dir = NULL;
  *tempname = NULL;

  *fh = fopen(filename, FOPEN_WRITETEXT);
  if(!*fh)
    goto fail;
  if(fstat(fileno(*fh), &sb) == -1 || !S_ISREG(sb.st_mode)) {
    return CURLE_OK;
  }
  fclose(*fh);
  *fh = NULL;

  result = Curl_rand_alnum(data, randbuf, sizeof(randbuf));
  if(result)
    goto fail;

  dir = dirslash(filename);
  if(dir) {
    /* The temp file name should not end up too long for the target file
       system */
    tempstore = aprintf("%s%s.tmp", dir, randbuf);
    free(dir);
  }

  if(!tempstore) {
    result = CURLE_OUT_OF_MEMORY;
    goto fail;
  }

  result = CURLE_WRITE_ERROR;
  fd = open(tempstore, O_WRONLY | O_CREAT | O_EXCL, 0600|sb.st_mode);
  if(fd == -1)
    goto fail;

  *fh = fdopen(fd, FOPEN_WRITETEXT);
  if(!*fh)
    goto fail;

  *tempname = tempstore;
  return CURLE_OK;

fail:
  if(fd != -1) {
    close(fd);
    unlink(tempstore);
  }

  free(tempstore);
  return result;
}